

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InlineReader.cpp
# Opt level: O0

InlineWriter * __thiscall adios2::core::engine::InlineReader::GetWriter(InlineReader *this)

{
  Mode MVar1;
  size_type sVar2;
  element_type *this_00;
  pointer ppVar3;
  element_type *peVar4;
  long in_RDI;
  InlineWriter *writer;
  shared_ptr<adios2::core::Engine> e;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<adios2::core::Engine>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<adios2::core::Engine>_>_>_>
  *engine_map;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<adios2::core::Engine>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<adios2::core::Engine>_>_>_>
  *in_stack_fffffffffffffe08;
  shared_ptr<adios2::core::Engine> *in_stack_fffffffffffffe10;
  InlineWriter *local_1c8;
  undefined8 in_stack_fffffffffffffe50;
  int commRank;
  string *in_stack_fffffffffffffe58;
  string *in_stack_fffffffffffffe60;
  string *in_stack_fffffffffffffe68;
  string *in_stack_fffffffffffffe70;
  allocator local_181;
  string local_180 [39];
  allocator local_159;
  string local_158 [39];
  allocator local_131;
  string local_130 [39];
  allocator local_109;
  string local_108 [32];
  InlineWriter *local_e8;
  _Base_ptr local_d8;
  __shared_ptr<adios2::core::Engine,_(__gnu_cxx::_Lock_policy)2> local_d0;
  undefined1 local_b9 [40];
  undefined1 local_91 [40];
  undefined1 local_69 [56];
  undefined1 local_31 [33];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<adios2::core::Engine>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<adios2::core::Engine>_>_>_>
  *local_10;
  
  commRank = (int)((ulong)in_stack_fffffffffffffe50 >> 0x20);
  local_10 = IO::GetEngines_abi_cxx11_(*(IO **)(in_RDI + 0x28));
  sVar2 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<adios2::core::Engine>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<adios2::core::Engine>_>_>_>
          ::size((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<adios2::core::Engine>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<adios2::core::Engine>_>_>_>
                  *)0xaa8375);
  if (sVar2 != 2) {
    in_stack_fffffffffffffe70 = (string *)local_31;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(local_31 + 1),"Engine",(allocator *)in_stack_fffffffffffffe70);
    in_stack_fffffffffffffe68 = (string *)local_69;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(local_69 + 1),"InlineReader",(allocator *)in_stack_fffffffffffffe68);
    in_stack_fffffffffffffe60 = (string *)local_91;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(local_91 + 1),"GetWriter",(allocator *)in_stack_fffffffffffffe60);
    in_stack_fffffffffffffe58 = (string *)local_b9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(local_b9 + 1),
               "There must be exactly one reader and one writer for the inline engine.",
               (allocator *)in_stack_fffffffffffffe58);
    helper::Throw<std::runtime_error>
              (in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,in_stack_fffffffffffffe60,
               in_stack_fffffffffffffe58,commRank);
    std::__cxx11::string::~string((string *)(local_b9 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_b9);
    std::__cxx11::string::~string((string *)(local_91 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_91);
    std::__cxx11::string::~string((string *)(local_69 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_69);
    std::__cxx11::string::~string((string *)(local_31 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_31);
  }
  local_d8 = (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<adios2::core::Engine>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<adios2::core::Engine>_>_>_>
             ::begin(in_stack_fffffffffffffe08);
  std::
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<adios2::core::Engine>_>_>
  ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<adios2::core::Engine>_>_>
                *)in_stack_fffffffffffffe10);
  std::shared_ptr<adios2::core::Engine>::shared_ptr
            (in_stack_fffffffffffffe10,(shared_ptr<adios2::core::Engine> *)in_stack_fffffffffffffe08
            );
  this_00 = std::__shared_ptr_access<adios2::core::Engine,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<adios2::core::Engine,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0xaa85ef);
  MVar1 = Engine::OpenMode(this_00);
  if (MVar1 == Read) {
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<adios2::core::Engine>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<adios2::core::Engine>_>_>_>
    ::rbegin(in_stack_fffffffffffffe08);
    ppVar3 = std::
             reverse_iterator<std::_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<adios2::core::Engine>_>_>_>
             ::operator->((reverse_iterator<std::_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<adios2::core::Engine>_>_>_>
                           *)in_stack_fffffffffffffe10);
    commRank = (int)((ulong)ppVar3 >> 0x20);
    std::shared_ptr<adios2::core::Engine>::operator=
              (in_stack_fffffffffffffe10,
               (shared_ptr<adios2::core::Engine> *)in_stack_fffffffffffffe08);
  }
  peVar4 = std::__shared_ptr<adios2::core::Engine,_(__gnu_cxx::_Lock_policy)2>::get(&local_d0);
  if (peVar4 == (element_type *)0x0) {
    local_1c8 = (InlineWriter *)0x0;
  }
  else {
    local_1c8 = (InlineWriter *)__dynamic_cast(peVar4,&Engine::typeinfo,&InlineWriter::typeinfo,0);
  }
  local_e8 = local_1c8;
  if (local_1c8 == (InlineWriter *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_108,"Engine",&local_109);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_130,"InlineReader",&local_131);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_158,"GetWriter",&local_159);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_180,"dynamic_cast<InlineWriter*> failed; this is very likely a bug.",&local_181
              );
    helper::Throw<std::runtime_error>
              (in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,in_stack_fffffffffffffe60,
               in_stack_fffffffffffffe58,commRank);
    std::__cxx11::string::~string(local_180);
    std::allocator<char>::~allocator((allocator<char> *)&local_181);
    std::__cxx11::string::~string(local_158);
    std::allocator<char>::~allocator((allocator<char> *)&local_159);
    std::__cxx11::string::~string(local_130);
    std::allocator<char>::~allocator((allocator<char> *)&local_131);
    std::__cxx11::string::~string(local_108);
    std::allocator<char>::~allocator((allocator<char> *)&local_109);
  }
  std::shared_ptr<adios2::core::Engine>::~shared_ptr((shared_ptr<adios2::core::Engine> *)0xaa88e4);
  return local_e8;
}

Assistant:

const InlineWriter *InlineReader::GetWriter() const
{
    const auto &engine_map = m_IO.GetEngines();
    if (engine_map.size() != 2)
    {
        helper::Throw<std::runtime_error>("Engine", "InlineReader", "GetWriter",
                                          "There must be exactly one reader and one "
                                          "writer for the inline engine.");
    }

    std::shared_ptr<Engine> e = engine_map.begin()->second;
    if (e->OpenMode() == adios2::Mode::Read)
    {
        e = engine_map.rbegin()->second;
    }

    const auto writer = dynamic_cast<InlineWriter *>(e.get());
    if (!writer)
    {
        helper::Throw<std::runtime_error>(
            "Engine", "InlineReader", "GetWriter",
            "dynamic_cast<InlineWriter*> failed; this is very likely a bug.");
    }
    return writer;
}